

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O0

size_t BIT_lookBits(BIT_DStream_t *bitD,U32 nbBits)

{
  U32 regMask;
  U32 nbBits_local;
  BIT_DStream_t *bitD_local;
  
  return ((bitD->bitContainer << ((byte)bitD->bitsConsumed & 0x3f)) >> 1) >>
         (0x3fU - (char)nbBits & 0x3f);
}

Assistant:

MEM_STATIC size_t BIT_lookBits(const BIT_DStream_t* bitD, U32 nbBits)
{
#if defined(__BMI__) && defined(__GNUC__)   /* experimental; fails if bitD->bitsConsumed + nbBits > sizeof(bitD->bitContainer)*8 */
    return BIT_getMiddleBits(bitD->bitContainer, (sizeof(bitD->bitContainer)*8) - bitD->bitsConsumed - nbBits, nbBits);
#else
    U32 const regMask = sizeof(bitD->bitContainer)*8 - 1;
    return ((bitD->bitContainer << (bitD->bitsConsumed & regMask)) >> 1) >> ((regMask-nbBits) & regMask);
#endif
}